

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Aig_Man_t * Saig_ManWindowExtractMiter(Aig_Man_t *p0,Aig_Man_t *p1)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *vNodes0;
  Vec_Ptr_t *vNodes0_00;
  Aig_Man_t *pNew;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  int iVar10;
  
  for (iVar9 = 0; iVar9 < p0->nTruePos; iVar9 = iVar9 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,iVar9);
    pAVar6 = Aig_ManCo(p1,iVar9);
    Aig_ObjSetRepr(p0,pAVar5,pAVar6);
    Aig_ObjSetRepr(p1,pAVar6,pAVar5);
  }
  iVar9 = 0;
  do {
    if (p0->nRegs <= iVar9) {
      Aig_ManCleanData(p0);
      Aig_ManCleanData(p1);
      vNodes0 = Saig_ManCollectedDiffNodes(p0,p1);
      vNodes0_00 = Saig_ManCollectedDiffNodes(p1,p0);
      iVar9 = vNodes0->nSize;
      iVar3 = vNodes0_00->nSize;
      pNew = Aig_ManStart(iVar3 + iVar9);
      pcVar7 = Abc_UtilStrsav("wnd");
      pNew->pName = pcVar7;
      pNew->pSpec = (char *)0x0;
      aVar1 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
      p0->pConst1->field_5 = aVar1;
      p1->pConst1->field_5 = aVar1;
      Saig_ManWindowCreatePis(pNew,p0,p1,vNodes0);
      Saig_ManWindowCreatePis(pNew,p1,p0,vNodes0_00);
      iVar10 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
        iVar10 = 0;
      }
      for (; iVar9 != iVar10; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0,iVar10);
        iVar2 = Saig_ObjIsLo(p0,pAVar5);
        if (iVar2 != 0) {
          pAVar6 = Aig_ObjCreateCi(pNew);
          (pAVar5->field_5).pData = pAVar6;
        }
      }
      iVar10 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0_00,iVar10);
        iVar2 = Saig_ObjIsLo(p1,pAVar5);
        if (iVar2 != 0) {
          pAVar6 = Aig_ObjCreateCi(pNew);
          (pAVar5->field_5).pData = pAVar6;
        }
      }
      for (iVar10 = 0; iVar9 != iVar10; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0,iVar10);
        if (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7) {
          pAVar6 = Aig_ObjChild0Copy(pAVar5);
          pAVar8 = Aig_ObjChild1Copy(pAVar5);
          pAVar6 = Aig_And(pNew,pAVar6,pAVar8);
          (pAVar5->field_5).pData = pAVar6;
        }
      }
      for (iVar10 = 0; iVar3 != iVar10; iVar10 = iVar10 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0_00,iVar10);
        if (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7) {
          pAVar6 = Aig_ObjChild0Copy(pAVar5);
          pAVar8 = Aig_ObjChild1Copy(pAVar5);
          pAVar6 = Aig_And(pNew,pAVar6,pAVar8);
          (pAVar5->field_5).pData = pAVar6;
        }
      }
      Saig_ManWindowCreatePos(pNew,p0,p1);
      iVar10 = 0;
      for (iVar2 = 0; iVar9 != iVar2; iVar2 = iVar2 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0,iVar2);
        iVar4 = Saig_ObjIsLo(p0,pAVar5);
        if (iVar4 != 0) {
          pAVar5 = Saig_ObjLoToLi(p0,pAVar5);
          pAVar5 = Aig_ObjChild0Copy(pAVar5);
          Aig_ObjCreateCo(pNew,pAVar5);
          iVar10 = iVar10 + 1;
        }
      }
      for (iVar9 = 0; iVar3 != iVar9; iVar9 = iVar9 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0_00,iVar9);
        iVar2 = Saig_ObjIsLo(p1,pAVar5);
        if (iVar2 != 0) {
          pAVar5 = Saig_ObjLoToLi(p1,pAVar5);
          pAVar5 = Aig_ObjChild0Copy(pAVar5);
          Aig_ObjCreateCo(pNew,pAVar5);
          iVar10 = iVar10 + 1;
        }
      }
      Aig_ManSetRegNum(pNew,iVar10);
      Aig_ManCleanup(pNew);
      Vec_PtrFree(vNodes0);
      Vec_PtrFree(vNodes0_00);
      return pNew;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,p0->nTruePos + iVar9);
    pAVar6 = Saig_ObjLiToLo(p0,pAVar5);
    if ((p0->pReprs != (Aig_Obj_t **)0x0) &&
       (pAVar8 = p0->pReprs[pAVar6->Id], pAVar8 != (Aig_Obj_t *)0x0)) {
      if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar6 != p1->pReprs[pAVar8->Id])) {
        __assert_fail("pMatch0 == Aig_ObjRepr( p1, pMatch1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x2df,"Aig_Man_t *Saig_ManWindowExtractMiter(Aig_Man_t *, Aig_Man_t *)");
      }
      pAVar6 = Saig_ObjLoToLi(p1,pAVar8);
      Aig_ObjSetRepr(p0,pAVar5,pAVar6);
      Aig_ObjSetRepr(p1,pAVar6,pAVar5);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj0, * pObj1, * pMatch0, * pMatch1;
    Vec_Ptr_t * vNodes0, * vNodes1;
    int i, nRegCount;
    // add matching of POs and LIs
    Saig_ManForEachPo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    Saig_ManForEachLi( p0, pObj0, i )
    {
        pMatch0 = Saig_ObjLiToLo( p0, pObj0 );
        pMatch1 = Aig_ObjRepr( p0, pMatch0 );
        if ( pMatch1 == NULL )
            continue;
        assert( pMatch0 == Aig_ObjRepr( p1, pMatch1 ) );
        pObj1 = Saig_ObjLoToLi( p1, pMatch1 );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    // clean the markings
    Aig_ManCleanData( p0 ); 
    Aig_ManCleanData( p1 ); 
    // collect nodes that are not linked
    vNodes0 = Saig_ManCollectedDiffNodes( p0, p1 );
    vNodes1 = Saig_ManCollectedDiffNodes( p1, p0 );
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes0) + Vec_PtrSize(vNodes1) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj0 = Aig_ManConst1( p0 );
    pObj0->pData = Aig_ManConst1( pNew );
    pObj1 = Aig_ManConst1( p1 );
    pObj1->pData = Aig_ManConst1( pNew );
    // create real PIs
    Saig_ManWindowCreatePis( pNew, p0, p1, vNodes0 );
    Saig_ManWindowCreatePis( pNew, p1, p0, vNodes1 );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
            pObj0->pData = Aig_ObjCreateCi(pNew);
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
            pObj1->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Aig_ObjIsNode(pObj0) )
            pObj0->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Aig_ObjIsNode(pObj1) )
            pObj1->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj1), Aig_ObjChild1Copy(pObj1) );
    }
    // create POs
    Saig_ManWindowCreatePos( pNew, p0, p1 );
//    Saig_ManWindowCreatePos( pNew, p1, p0 );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
        {
            pMatch0 = Saig_ObjLoToLi( p0, pObj0 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch0) );
            nRegCount++;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
        {
            pMatch1 = Saig_ObjLoToLi( p1, pObj1 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch1) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    return pNew;
}